

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dice.cpp
# Opt level: O2

void __thiscall Dice::rollAggressiveComputer(Dice *this)

{
  map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  *this_00;
  map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  *pmVar1;
  int iVar2;
  mapped_type *pmVar3;
  int i_1;
  int iVar4;
  int i;
  bool bVar5;
  DiceOptions value_1;
  DiceOptions local_74;
  key_type local_70;
  DiceOptions value;
  map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  *local_68;
  _Rb_tree<Dice::DiceOptions,_std::pair<const_Dice::DiceOptions,_int>,_std::_Select1st<std::pair<const_Dice::DiceOptions,_int>_>,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  local_60;
  
  this_00 = &this->DiceValues;
  iVar4 = 6;
  while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
    iVar2 = rand();
    value = iVar2 % 6;
    pmVar3 = std::
             map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
             ::operator[](this_00,&value);
    *pmVar3 = *pmVar3 + 1;
  }
  value_1 = Attack;
  pmVar3 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](this_00,&value_1);
  iVar4 = *pmVar3;
  pmVar1 = &this->resolvedHand;
  local_74 = Attack;
  pmVar3 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](pmVar1,&local_74);
  *pmVar3 = *pmVar3 + iVar4;
  value_1 = Destruction;
  pmVar3 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](this_00,&value_1);
  iVar4 = *pmVar3;
  local_74 = Destruction;
  local_68 = pmVar1;
  pmVar3 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[](pmVar1,&local_74);
  *pmVar3 = *pmVar3 + iVar4;
  resetDiceValuesMap(this);
  iVar4 = addToCount(this);
  if (iVar4 < 6) {
    iVar4 = 0;
    while( true ) {
      iVar2 = addToCount(this);
      if (6 - iVar2 <= iVar4) break;
      iVar2 = rand();
      value_1 = iVar2 % 6;
      pmVar3 = std::
               map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
               ::operator[](this_00,&value_1);
      *pmVar3 = *pmVar3 + 1;
      iVar4 = iVar4 + 1;
    }
    local_74 = Attack;
    pmVar3 = std::
             map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
             ::operator[](this_00,&local_74);
    pmVar1 = local_68;
    iVar4 = *pmVar3;
    local_70 = Attack;
    pmVar3 = std::
             map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
             ::operator[](local_68,&local_70);
    *pmVar3 = *pmVar3 + iVar4;
    local_74 = Destruction;
    pmVar3 = std::
             map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
             ::operator[](this_00,&local_74);
    iVar4 = *pmVar3;
    local_70 = Destruction;
    pmVar3 = std::
             map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
             ::operator[](pmVar1,&local_70);
    *pmVar3 = *pmVar3 + iVar4;
    resetDiceValuesMap(this);
  }
  iVar4 = addToCount(this);
  if (iVar4 < 6) {
    iVar4 = 0;
    while( true ) {
      iVar2 = addToCount(this);
      if (6 - iVar2 <= iVar4) break;
      iVar2 = rand();
      value_1 = iVar2 % 6;
      pmVar3 = std::
               map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
               ::operator[](this_00,&value_1);
      *pmVar3 = *pmVar3 + 1;
      iVar4 = iVar4 + 1;
    }
  }
  addDiceValuesToResolvedHand(this);
  std::
  _Rb_tree<Dice::DiceOptions,_std::pair<const_Dice::DiceOptions,_int>,_std::_Select1st<std::pair<const_Dice::DiceOptions,_int>_>,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  ::_Rb_tree(&local_60,&local_68->_M_t);
  std::
  vector<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
  ::push_back(&this->historyOfResolvedRolls,(value_type *)&local_60);
  std::
  _Rb_tree<Dice::DiceOptions,_std::pair<const_Dice::DiceOptions,_int>,_std::_Select1st<std::pair<const_Dice::DiceOptions,_int>_>,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
  ::~_Rb_tree(&local_60);
  resetResolvedHand(this);
  resetDiceValuesMap(this);
  return;
}

Assistant:

void Dice::rollAggressiveComputer(){

    DiceOptions value;
    for(int i=0; i<6; i++)
    {
        value = randomDiceOption();
        this->DiceValues[value] ++;
    }

    this->resolvedHand[Attack] += this->DiceValues[Attack];
    this->resolvedHand[Destruction] += this->DiceValues[Destruction];

    resetDiceValuesMap();

    if(addToCount() <6){
        DiceOptions value;
        for(int i=0; i<6-addToCount(); i++)
        {
            value = randomDiceOption();
            this->DiceValues[value] ++;
        }

        this->resolvedHand[Attack] += this->DiceValues[Attack];
        this->resolvedHand[Destruction] += this->DiceValues[Destruction];
        resetDiceValuesMap();
    }

    if(addToCount() < 6){
        DiceOptions value;
        for(int i=0; i<6-addToCount(); i++)
        {
            value = randomDiceOption();
            this->DiceValues[value] ++;
        }
    }

    addDiceValuesToResolvedHand();
    storeResolvedHand(resolvedHand);

    resetResolvedHand();
    resetDiceValuesMap();

}